

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workerpool.c
# Opt level: O1

void workerpool_destroy(workerpool_t *wp)

{
  pthread_mutex_t *__mutex;
  zarray_t *__ptr;
  long lVar1;
  int iVar2;
  
  if (wp != (workerpool_t *)0x0) {
    if (1 < wp->nthreads) {
      if (0 < wp->nthreads) {
        iVar2 = 0;
        do {
          workerpool_add_task(wp,(_func_void_void_ptr *)0x0,(void *)0x0);
          iVar2 = iVar2 + 1;
        } while (iVar2 < wp->nthreads);
      }
      __mutex = &wp->mutex;
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      pthread_cond_broadcast((pthread_cond_t *)&wp->startcond);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      if (0 < wp->nthreads) {
        lVar1 = 0;
        do {
          pthread_join(wp->threads[lVar1],(void **)0x0);
          lVar1 = lVar1 + 1;
        } while (lVar1 < wp->nthreads);
      }
      pthread_mutex_destroy((pthread_mutex_t *)__mutex);
      pthread_cond_destroy((pthread_cond_t *)&wp->startcond);
      pthread_cond_destroy((pthread_cond_t *)&wp->endcond);
      free(wp->threads);
    }
    __ptr = wp->tasks;
    if (__ptr != (zarray_t *)0x0) {
      if (__ptr->data != (char *)0x0) {
        free(__ptr->data);
      }
      __ptr->el_sz = 0;
      __ptr->size = 0;
      __ptr->alloc = 0;
      __ptr->data = (char *)0x0;
      free(__ptr);
    }
    free(wp);
    return;
  }
  return;
}

Assistant:

void workerpool_destroy(workerpool_t *wp)
{
    if (wp == NULL)
        return;

    // force all worker threads to exit.
    if (wp->nthreads > 1) {
        for (int i = 0; i < wp->nthreads; i++)
            workerpool_add_task(wp, NULL, NULL);

        pthread_mutex_lock(&wp->mutex);
        pthread_cond_broadcast(&wp->startcond);
        pthread_mutex_unlock(&wp->mutex);

        for (int i = 0; i < wp->nthreads; i++)
            pthread_join(wp->threads[i], NULL);

        pthread_mutex_destroy(&wp->mutex);
        pthread_cond_destroy(&wp->startcond);
        pthread_cond_destroy(&wp->endcond);
        free(wp->threads);
    }

    zarray_destroy(wp->tasks);
    free(wp);
}